

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gds2writer.cpp
# Opt level: O3

void __thiscall GDS2Writer::writeHeader(GDS2Writer *this)

{
  ushort uVar1;
  undefined4 local_2c;
  
  local_2c._0_2_ = 0x600;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x200;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x300;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x1c00;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x201;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x1200;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x602;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x4141;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x1400;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c = CONCAT22(local_2c._2_2_,0x503);
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c = 0x3789413e;
  fwrite(&local_2c,4,1,(FILE *)this->m_fout);
  local_2c = 0xefa7c64b;
  fwrite(&local_2c,4,1,(FILE *)this->m_fout);
  local_2c = 0x2fb84439;
  fwrite(&local_2c,4,1,(FILE *)this->m_fout);
  local_2c = 0x545a9ba0;
  fwrite(&local_2c,4,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x1c00;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0x205;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c._0_2_ = 0;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  uVar1 = (ushort)(int)(this->m_designName)._M_string_length;
  uVar1 = uVar1 + (uVar1 & 1) + 4;
  local_2c._0_2_ = uVar1 * 0x100 | uVar1 >> 8;
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  local_2c = CONCAT22(local_2c._2_2_,0x606);
  fwrite(&local_2c,2,1,(FILE *)this->m_fout);
  writeString(this,&this->m_designName);
  return;
}

Assistant:

void GDS2Writer::writeHeader()
{
    // HEADER record
    writeUint16(0x0006);    // Len = 6 bytes
    writeUint16(0x0002);    // HEADER id
    writeUint16(0x0003);    // version 3?

    // BGNLIB
    writeUint16(0x001C);    // Len
    writeUint16(0x0102);    // BGNLIB id
    writeUint16(0x0000);    // year (last modified)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second
    writeUint16(0x0000);    // year (last accessed)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second    

    // LIBNAME
    writeUint16(0x0012);    // Len 18
    writeUint16(0x0206);    // LIBNAME id
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);

    // UNITS
    writeUint16(0x0014);     // two 8-byte real
    writeUint16(0x0305);    // UNITS id
    writeUint32(0x3E418937);
    writeUint32(0x4BC6A7EF);    
    writeUint32(0x3944B82F);
    writeUint32(0xA09B5A54);    
    
    // BGNSTR
    writeUint16(0x001C);    // Len
    writeUint16(0x0502);    // BGNSTR id
    writeUint16(0x0000);    // year (last modified)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second
    writeUint16(0x0000);    // year (last accessed)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second

    // STRNAME 
    uint32_t bytes = m_designName.size() + (m_designName.size() % 2);
    writeUint16(bytes+4);   // Len
    writeUint16(0x0606);    // STRNAME id
    writeString(m_designName);
}